

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O3

lu_int basiclu_obj_get_factors
                 (basiclu_object *obj,lu_int *rowperm,lu_int *colperm,lu_int *Lcolptr,
                 lu_int *Lrowidx,double *Lvalue,lu_int *Ucolptr,lu_int *Urowidx,double *Uvalue)

{
  lu_int lVar1;
  
  if (((obj != (basiclu_object *)0x0) && (obj->istore != (lu_int *)0x0)) &&
     (obj->xstore != (double *)0x0)) {
    lVar1 = basiclu_get_factors(obj->istore,obj->xstore,obj->Li,obj->Lx,obj->Ui,obj->Ux,obj->Wi,
                                obj->Wx,rowperm,colperm,Lcolptr,Lrowidx,Lvalue,Ucolptr,Urowidx,
                                Uvalue);
    return lVar1;
  }
  return -8;
}

Assistant:

lu_int basiclu_obj_get_factors(struct basiclu_object *obj,
                               lu_int rowperm[], lu_int colperm[],
                               lu_int Lcolptr[], lu_int Lrowidx[],
                               double Lvalue[], lu_int Ucolptr[],
                               lu_int Urowidx[], double Uvalue[])
{
    if (!isvalid(obj))
        return BASICLU_ERROR_invalid_object;

    return basiclu_get_factors(obj->istore, obj->xstore, obj->Li, obj->Lx,
                               obj->Ui, obj->Ux, obj->Wi, obj->Wx, rowperm,
                               colperm, Lcolptr, Lrowidx, Lvalue, Ucolptr,
                               Urowidx, Uvalue);
}